

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O2

Stats * __thiscall
SpecificStrategy::extractStats(Stats *__return_storage_ptr__,SpecificStrategy *this,Info *info)

{
  _Base_ptr p_Var1;
  Call call;
  Call CStack_68;
  
  __return_storage_ptr__->_vptr_Stats = (_func_int **)&PTR__Stats_00118ce8;
  __return_storage_ptr__->calls = 0;
  __return_storage_ptr__->indirects = 0;
  __return_storage_ptr__->instrs =
       (int)(info->instrs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->blocks).perfect =
       (int)(info->blocks).perfect._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->blocks).conflict =
       (int)(info->blocks).conflict._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __return_storage_ptr__->phantoms =
       (int)(info->phantoms)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->edges).internal.perfect =
       (int)(info->edges).internal.perfect._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->edges).internal.conflict =
       (int)(info->edges).internal.conflict._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->edges).external.perfect =
       (int)(info->edges).external.perfect._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->edges).external.conflict =
       (int)(info->edges).external.conflict._M_t._M_impl.super__Rb_tree_header._M_node_count;
  for (p_Var1 = (info->calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(info->calls)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    CfgData::Call::Call(&CStack_68,(Call *)(p_Var1 + 1));
    __return_storage_ptr__->calls =
         __return_storage_ptr__->calls +
         (int)CStack_68.calls._M_t._M_impl.super__Rb_tree_header._M_node_count;
    CfgData::Call::~Call(&CStack_68);
  }
  __return_storage_ptr__->indirects =
       __return_storage_ptr__->indirects +
       (int)(info->indirects)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  return __return_storage_ptr__;
}

Assistant:

SpecificStrategy::Stats SpecificStrategy::extractStats(const SpecificStrategy::Info& info) {
	Stats s;

	s.instrs = info.instrs.size();

	s.blocks.perfect = info.blocks.perfect.size();
	s.blocks.conflict = info.blocks.conflict.size();

	s.phantoms += info.phantoms.size();

	s.edges.internal.perfect = info.edges.internal.perfect.size();
	s.edges.internal.conflict = info.edges.internal.conflict.size();
	s.edges.external.perfect = info.edges.external.perfect.size();
	s.edges.external.conflict = info.edges.external.conflict.size();

	s.calls = 0;
	for (CfgData::Call call : info.calls)
		s.calls += call.calls.size();

	s.indirects += info.indirects.size();

	return s;
}